

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O0

int lj_cf_ffi_cast(lua_State *L)

{
  CTState *cts_00;
  CTypeID CVar1;
  TValue *o_00;
  void *pvVar2;
  GCcdata *cd;
  TValue *o;
  CType *d;
  CTypeID id;
  CTState *cts;
  lua_State *L_local;
  CTState *cts_1;
  CType *local_100;
  CType *ct;
  GCcdata *cd_1;
  
  cts_00 = *(CTState **)((L->glref).ptr64 + 0x180);
  cts_00->L = L;
  CVar1 = ffi_checkctype(L,cts_00,(TValue *)0x0);
  for (local_100 = cts_00->tab + CVar1; local_100->info >> 0x1c == 8;
      local_100 = cts_00->tab + (local_100->info & 0xffff)) {
  }
  o_00 = lj_lib_checkany(L,2);
  L->top = o_00 + 1;
  if (((local_100->info >> 0x1c != 0) && (local_100->info >> 0x1c != 2)) &&
     (local_100->info >> 0x1c != 5)) {
    lj_err_arg(L,1,LJ_ERR_FFI_INVTYPE);
  }
  if (((int)(o_00->field_4).it >> 0xf != -0xb) ||
     (*(ushort *)((o_00->u64 & 0x7fffffffffff) + 10) != CVar1)) {
    pvVar2 = lj_mem_newgco(cts_00->L,(ulong)local_100->size + 0x10);
    *(undefined1 *)((long)pvVar2 + 9) = 10;
    *(short *)((long)pvVar2 + 10) = (short)CVar1;
    lj_cconv_ct_tv(cts_00,local_100,(uint8_t *)((long)pvVar2 + 0x10),o_00,1);
    o_00->u64 = (ulong)pvVar2 | 0xfffa800000000000;
    if (*(ulong *)((L->glref).ptr64 + 0x18) <= *(ulong *)((L->glref).ptr64 + 0x10)) {
      lj_gc_step(L);
    }
  }
  return 1;
}

Assistant:

LJLIB_CF(ffi_cast)	LJLIB_REC(ffi_new)
{
  CTState *cts = ctype_cts(L);
  CTypeID id = ffi_checkctype(L, cts, NULL);
  CType *d = ctype_raw(cts, id);
  TValue *o = lj_lib_checkany(L, 2);
  L->top = o+1;  /* Make sure this is the last item on the stack. */
  if (!(ctype_isnum(d->info) || ctype_isptr(d->info) || ctype_isenum(d->info)))
    lj_err_arg(L, 1, LJ_ERR_FFI_INVTYPE);
  if (!(tviscdata(o) && cdataV(o)->ctypeid == id)) {
    GCcdata *cd = lj_cdata_new(cts, id, d->size);
    lj_cconv_ct_tv(cts, d, cdataptr(cd), o, CCF_CAST);
    setcdataV(L, o, cd);
    lj_gc_check(L);
  }
  return 1;
}